

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O1

bool libcellml::isEuropeanNumericCharacter(char c)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  initializer_list<char> __l;
  set<char,_std::less<char>,_std::allocator<char>_> validIntegerCharacters;
  allocator_type local_4c;
  less<char> local_4b;
  char local_4a [10];
  _Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_> local_40;
  
  builtin_strncpy(local_4a,"0123456789",10);
  __l._M_len = 10;
  __l._M_array = local_4a;
  std::set<char,_std::less<char>,_std::allocator<char>_>::set
            ((set<char,_std::less<char>,_std::allocator<char>_> *)&local_40,__l,&local_4b,&local_4c)
  ;
  p_Var1 = &local_40._M_impl.super__Rb_tree_header;
  p_Var2 = &p_Var1->_M_header;
  for (; (_Rb_tree_header *)local_40._M_impl.super__Rb_tree_header._M_header._M_parent !=
         (_Rb_tree_header *)0x0;
      local_40._M_impl.super__Rb_tree_header._M_header._M_parent =
           (&(local_40._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_left)
           [(char)*(size_t *)(local_40._M_impl.super__Rb_tree_header._M_header._M_parent + 1) < c])
  {
    if (c <= (char)*(size_t *)(local_40._M_impl.super__Rb_tree_header._M_header._M_parent + 1)) {
      p_Var2 = local_40._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
  }
  p_Var3 = p_Var1;
  if (((_Rb_tree_header *)p_Var2 != p_Var1) &&
     (p_Var3 = (_Rb_tree_header *)p_Var2, c < (char)((_Rb_tree_header *)p_Var2)->_M_node_count)) {
    p_Var3 = p_Var1;
  }
  std::_Rb_tree<char,_char,_std::_Identity<char>,_std::less<char>,_std::allocator<char>_>::~_Rb_tree
            (&local_40);
  return p_Var3 != p_Var1;
}

Assistant:

bool isEuropeanNumericCharacter(char c)
{
    const std::set<char> validIntegerCharacters = {'0', '1', '2', '3', '4', '5', '6', '7', '8', '9'};
    return validIntegerCharacters.find(c) != validIntegerCharacters.end();
}